

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_hex(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  uint uVar2;
  undefined1 n [16];
  string_view prefix;
  int num_digits_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  char *in_RDI;
  size_t unaff_retaddr;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_00000008;
  anon_class_16_2_cb75083a_for_f_conflict1 in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  basic_format_specs<char> *in_stack_ffffffffffffffe8;
  char *pcVar4;
  
  if (*(char *)(*(long *)(in_RDI + 0x10) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x34);
    *(uint *)(in_RDI + 0x34) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x30] = '0';
    cVar1 = *(char *)(*(long *)(in_RDI + 0x10) + 8);
    uVar2 = *(uint *)(in_RDI + 0x34);
    *(uint *)(in_RDI + 0x34) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x30] = cVar1;
  }
  n._8_8_ = in_stack_ffffffffffffff90;
  n._0_8_ = in_stack_ffffffffffffff88;
  pcVar4 = in_RDI;
  num_digits_00 =
       count_digits<4u,unsigned__int128>(*(detail **)(in_RDI + 0x20),(unsigned___int128)n);
  get_prefix((int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
              *)0x279ad4);
  prefix.size_ = unaff_retaddr;
  prefix.data_ = pcVar4;
  bVar3 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::on_hex()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    (in_stack_00000008,num_digits_00,prefix,in_stack_ffffffffffffffe8,
                     in_stack_00000020);
  *(buffer<char> **)in_RDI = bVar3.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }